

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaTypePtr pxVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  xmlSchemaTypePtr prim;
  xmlSchemaFacetPtr fac;
  int normVal;
  int needVal;
  int has;
  xmlSchemaTypePtr type_local;
  
  bVar4 = false;
  bVar5 = false;
  bVar3 = (type->baseType->flags & 0x8000000U) != 0;
  if (bVar3) {
    bVar4 = (type->baseType->flags & 0x200000U) != 0;
    bVar5 = (type->baseType->flags & 0x10000000U) != 0;
  }
  if (type->facets != (xmlSchemaFacetPtr)0x0) {
    for (prim = (xmlSchemaTypePtr)type->facets; prim != (xmlSchemaTypePtr)0x0; prim = prim->next) {
      xVar1 = prim->type;
      if (xVar1 == XML_SCHEMA_FACET_PATTERN) {
        bVar5 = true;
        bVar3 = true;
      }
      else if (xVar1 == XML_SCHEMA_FACET_ENUMERATION) {
        bVar4 = true;
        bVar5 = true;
        bVar3 = true;
      }
      else if (xVar1 != XML_SCHEMA_FACET_WHITESPACE) {
        bVar3 = true;
      }
    }
  }
  if (bVar5) {
    type->flags = type->flags | 0x10000000;
  }
  if (bVar4) {
    type->flags = type->flags | 0x200000;
  }
  if ((((bVar3) && (type->flags = type->flags | 0x8000000, !bVar4)) && ((type->flags & 0x100U) != 0)
      ) && ((pxVar2 = xmlSchemaGetPrimitiveType(type), pxVar2->builtInType != 0x2e &&
            (pxVar2->builtInType != 1)))) {
    type->flags = type->flags | 0x200000;
  }
  return;
}

Assistant:

static void
xmlSchemaTypeFixupOptimFacets(xmlSchemaTypePtr type)
{
    int has = 0, needVal = 0, normVal = 0;

    has	= (type->baseType->flags & XML_SCHEMAS_TYPE_HAS_FACETS) ? 1 : 0;
    if (has) {
	needVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_FACETSNEEDVALUE) ? 1 : 0;
	normVal = (type->baseType->flags &
	    XML_SCHEMAS_TYPE_NORMVALUENEEDED) ? 1 : 0;
    }
    if (type->facets != NULL) {
	xmlSchemaFacetPtr fac;

	for (fac = type->facets; fac != NULL; fac = fac->next) {
	    switch (fac->type) {
		case XML_SCHEMA_FACET_WHITESPACE:
		    break;
		case XML_SCHEMA_FACET_PATTERN:
		    normVal = 1;
		    has = 1;
		    break;
		case XML_SCHEMA_FACET_ENUMERATION:
		    needVal = 1;
		    normVal = 1;
		    has = 1;
		    break;
		default:
		    has = 1;
		    break;
	    }
	}
    }
    if (normVal)
	type->flags |= XML_SCHEMAS_TYPE_NORMVALUENEEDED;
    if (needVal)
	type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
    if (has)
	type->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;

    if (has && (! needVal) && WXS_IS_ATOMIC(type)) {
	xmlSchemaTypePtr prim = xmlSchemaGetPrimitiveType(type);
	/*
	* OPTIMIZE VAL TODO: Some facets need a computed value.
	*/
	if ((prim->builtInType != XML_SCHEMAS_ANYSIMPLETYPE) &&
	    (prim->builtInType != XML_SCHEMAS_STRING)) {
	    type->flags |= XML_SCHEMAS_TYPE_FACETSNEEDVALUE;
	}
    }
}